

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_28;
  ImGuiWindow *local_20;
  ImGuiWindow *this_local;
  
  fVar1 = (this->SizeFull).x;
  fVar2 = (this->Pos).x;
  fVar3 = (this->Pos).y;
  local_20 = this;
  fVar4 = TitleBarHeight(this);
  ImVec2::ImVec2(&local_28,fVar2 + fVar1,fVar3 + fVar4);
  ImRect::ImRect((ImRect *)&this_local,&this->Pos,&local_28);
  return _this_local;
}

Assistant:

ImRect      TitleBarRect() const        { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }